

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LRUMap.hh
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
phosg::
LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::at(LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k)

{
  long *plVar1;
  iterator iVar2;
  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Item>,_false,_true>
  _Var3;
  long in_RCX;
  long lVar4;
  undefined8 extraout_RDX;
  char *pcVar5;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Item>,_false,_true>,_bool>
  pVar6;
  long lStack_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_38;
  undefined1 *puStack_30;
  undefined8 uStack_28;
  LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pLStack_20;
  
  pLStack_20 = (LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x107142;
  iVar2 = ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Item>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Item>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->items)._M_h,k);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Item>,_true>
      ._M_cur != (__node_type *)0x0) {
    pLStack_20 = (LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x107156;
    touch_item(this,(Item *)((long)iVar2.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Item>,_true>
                                   ._M_cur + 0x28));
    return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)iVar2.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Item>,_true>
                  ._M_cur + 0x40);
  }
  pcVar5 = "_Map_base::at";
  pLStack_20 = (LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x107171;
  ::std::__throw_out_of_range("_Map_base::at");
  puStack_30 = (undefined1 *)&lStack_40;
  lStack_40 = in_RCX;
  pbStack_38 = k;
  uStack_28 = extraout_RDX;
  pLStack_20 = this;
  pVar6 = ::std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,phosg::LRUMap<std::__cxx11::string,std::__cxx11::string>::Item>,std::allocator<std::pair<std::__cxx11::string_const,phosg::LRUMap<std::__cxx11::string,std::__cxx11::string>::Item>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_emplace<std::piecewise_construct_t_const&,std::tuple<std::__cxx11::string&&>,std::tuple<std::__cxx11::string&&,unsigned_long&>>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,phosg::LRUMap<std::__cxx11::string,std::__cxx11::string>::Item>,std::allocator<std::pair<std::__cxx11::string_const,phosg::LRUMap<std::__cxx11::string,std::__cxx11::string>::Item>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)(pcVar5 + 0x18),&::std::piecewise_construct,&pbStack_38);
  _Var3 = pVar6.first.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Item>,_true>
          ._M_cur;
  if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    *(long *)((long)_Var3.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Item>,_true>
                    ._M_cur + 0x38) =
         (long)_Var3.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Item>,_true>
               ._M_cur + 8;
    *(long *)((long)_Var3.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Item>,_true>
                    ._M_cur + 0x60) = lStack_40;
    *(long *)(pcVar5 + 0x50) = *(long *)(pcVar5 + 0x50) + lStack_40;
    lVar4 = (long)_Var3.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Item>,_true>
                  ._M_cur + 0x28;
    plVar1 = *(long **)(pcVar5 + 8);
    *(long **)((long)_Var3.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Item>,_true>
                     ._M_cur + 0x30) = plVar1;
    if (plVar1 != (long *)0x0) {
      *plVar1 = lVar4;
    }
    *(long *)(pcVar5 + 8) = lVar4;
    if (*(long *)(pcVar5 + 0x10) == 0) {
      *(long *)(pcVar5 + 0x10) = lVar4;
    }
  }
  return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (pVar6._8_8_ & 0xffffff01);
}

Assistant:

ValueT& at(const KeyT& k) {
    Item& item = this->items.at(k);
    this->touch_item(item);
    return item.value;
  }